

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t scan_for_signature(archive_read *a)

{
  size_t i;
  long lVar1;
  long *plVar2;
  char signature [8];
  ssize_t local_20;
  long local_18;
  
  lVar1 = 0;
  do {
    *(byte *)((long)&local_18 + lVar1) = rar5_signature_xor[lVar1] ^ 0xa1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_20 = -1;
  plVar2 = (long *)__archive_read_ahead(a,0x200,&local_20);
  if (plVar2 != (long *)0x0) {
    do {
      lVar1 = -8;
      do {
        if (*plVar2 == local_18) {
          plVar2 = (long *)__archive_read_consume(a,-lVar1);
          goto LAB_00133234;
        }
        lVar1 = lVar1 + -1;
        plVar2 = (long *)((long)plVar2 + 1);
      } while (lVar1 != -0x200);
      __archive_read_consume(a,0x200);
      local_20 = -1;
      plVar2 = (long *)__archive_read_ahead(a,0x200,&local_20);
    } while (plVar2 != (long *)0x0);
    plVar2 = (long *)0x0;
  }
LAB_00133234:
  return (wchar_t)plVar2;
}

Assistant:

static int scan_for_signature(struct archive_read* a) {
	const uint8_t* p;
	const int chunk_size = 512;
	ssize_t i;
	char signature[sizeof(rar5_signature_xor)];

	/* If we're here, it means we're on an 'unknown territory' data.
	 * There's no indication what kind of data we're reading here.
	 * It could be some text comment, any kind of binary data,
	 * digital sign, dragons, etc.
	 *
	 * We want to find a valid RARv5 magic header inside this unknown
	 * data. */

	/* Is it possible in libarchive to just skip everything until the
	 * end of the file? If so, it would be a better approach than the
	 * current implementation of this function. */

	rar5_signature(signature);

	while(1) {
		if(!read_ahead(a, chunk_size, &p))
			return ARCHIVE_EOF;

		for(i = 0; i < chunk_size - (int)sizeof(rar5_signature_xor);
		    i++) {
			if(memcmp(&p[i], signature,
			    sizeof(rar5_signature_xor)) == 0) {
				/* Consume the number of bytes we've used to
				 * search for the signature, as well as the
				 * number of bytes used by the signature
				 * itself. After this we should be standing
				 * on a valid base block header. */
				(void) consume(a,
				    i + sizeof(rar5_signature_xor));
				return ARCHIVE_OK;
			}
		}

		consume(a, chunk_size);
	}

	return ARCHIVE_FATAL;
}